

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrieinp.c
# Opt level: O3

void * tommy_trie_inplace_remove(tommy_trie_inplace *trie_inplace,tommy_key_t key)

{
  long lVar1;
  tommy_trie_inplace_node *ptVar2;
  tommy_key_t in_ECX;
  void *pvVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar3 = (void *)0x0;
  ptVar2 = trie_inplace_bucket_remove
                     ((int)trie_inplace + (key >> 0x1a) * 8,(tommy_trie_inplace_node **)0x0,
                      (tommy_trie_inplace_node *)(ulong)key,in_ECX);
  if (ptVar2 != (tommy_trie_inplace_node *)0x0) {
    trie_inplace->count = trie_inplace->count - 1;
    pvVar3 = ptVar2->data;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pvVar3;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_trie_inplace_remove(tommy_trie_inplace* trie_inplace, tommy_key_t key)
{
	tommy_trie_inplace_node* ret;
	tommy_trie_inplace_node** let_ptr;

	let_ptr = &trie_inplace->bucket[key >> TOMMY_TRIE_INPLACE_BUCKET_SHIFT];

	ret = trie_inplace_bucket_remove(TOMMY_TRIE_INPLACE_BUCKET_SHIFT, let_ptr, 0, key);

	if (!ret)
		return 0;

	--trie_inplace->count;

	return ret->data;
}